

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo-history.cpp
# Opt level: O3

void __thiscall rtosc::UndoHistoryImpl::rewind(UndoHistoryImpl *this,FILE *__stream)

{
  char *pcVar1;
  rtosc_arg_t rVar2;
  rtosc_arg_t arg;
  char *local_40;
  rtosc_arg_t local_38;
  
  memset(tmp,0,0x100);
  local_38 = rtosc_argument((char *)__stream,1);
  rVar2 = rtosc_argument((char *)__stream,0);
  pcVar1 = rtosc_argument_string((char *)__stream);
  rtosc_amessage(tmp,0x100,rVar2.s,pcVar1 + 2,&local_38);
  local_40 = tmp;
  if ((this->cb).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->cb)._M_invoker)((_Any_data *)&this->cb,&local_40);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void UndoHistoryImpl::rewind(const char *msg)
{
    memset(tmp, 0, sizeof(tmp));
    rtosc_arg_t arg = rtosc_argument(msg,1);
    rtosc_amessage(tmp, 256, rtosc_argument(msg,0).s,
            rtosc_argument_string(msg)+2,
            &arg);
    cb(tmp);
}